

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

void mjs::anon_unknown_35::anon_unknown_5::throw_uri_error(gc_heap_ptr<mjs::global_object> *global)

{
  native_error_exception *this;
  global_object *this_00;
  wstring local_58;
  wstring_view local_38;
  wstring_view local_28;
  
  this = (native_error_exception *)__cxa_allocate_exception(0x58);
  this_00 = (global_object *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  global_object::stack_trace_abi_cxx11_(&local_58,this_00);
  local_28._M_len = local_58._M_string_length;
  local_28._M_str = local_58._M_dataplus._M_p;
  local_38._M_len = 0xd;
  local_38._M_str = L"URI malformed";
  native_error_exception::native_error_exception(this,uri,&local_28,&local_38);
  __cxa_throw(this,&native_error_exception::typeinfo,native_error_exception::~native_error_exception
             );
}

Assistant:

[[noreturn]] void throw_uri_error(const gc_heap_ptr<global_object>& global) {
    throw native_error_exception{native_error_type::uri, global->stack_trace(), L"URI malformed"};
}